

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

int check_revocation(X509_STORE_CTX *ctx)

{
  int iVar1;
  size_t sVar2;
  int local_20;
  int local_1c;
  int i;
  int last;
  X509_STORE_CTX *ctx_local;
  
  if ((ctx->param->flags & 4) != 0) {
    if ((ctx->param->flags & 8) == 0) {
      local_1c = 0;
    }
    else {
      sVar2 = sk_X509_num(ctx->chain);
      local_1c = (int)sVar2 + -1;
    }
    for (local_20 = 0; local_20 <= local_1c; local_20 = local_20 + 1) {
      ctx->error_depth = local_20;
      iVar1 = check_cert(ctx);
      if (iVar1 == 0) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

static int check_revocation(X509_STORE_CTX *ctx) {
  if (!(ctx->param->flags & X509_V_FLAG_CRL_CHECK)) {
    return 1;
  }
  int last;
  if (ctx->param->flags & X509_V_FLAG_CRL_CHECK_ALL) {
    last = (int)sk_X509_num(ctx->chain) - 1;
  } else {
    last = 0;
  }
  for (int i = 0; i <= last; i++) {
    ctx->error_depth = i;
    if (!check_cert(ctx)) {
      return 0;
    }
  }
  return 1;
}